

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprIsInteger(Expr *p,int *pValue)

{
  int iVar1;
  int v;
  int local_c;
  
  iVar1 = 0;
  if (p != (Expr *)0x0) {
    while ((p->flags & 0x400) == 0) {
      if (p->op != 0xa6) {
        if (p->op != 0xa5) {
          return 0;
        }
        iVar1 = sqlite3ExprIsInteger(p->pLeft,&local_c);
        if (iVar1 == 0) {
          return 0;
        }
        local_c = -local_c;
        goto LAB_0017056d;
      }
      p = p->pLeft;
      if (p == (Expr *)0x0) {
        return 0;
      }
    }
    local_c = (p->u).iValue;
LAB_0017056d:
    *pValue = local_c;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsInteger(Expr *p, int *pValue){
  int rc = 0;
  if( p==0 ) return 0;  /* Can only happen following on OOM */

  /* If an expression is an integer literal that fits in a signed 32-bit
  ** integer, then the EP_IntValue flag will have already been set */
  assert( p->op!=TK_INTEGER || (p->flags & EP_IntValue)!=0
           || sqlite3GetInt32(p->u.zToken, &rc)==0 );

  if( p->flags & EP_IntValue ){
    *pValue = p->u.iValue;
    return 1;
  }
  switch( p->op ){
    case TK_UPLUS: {
      rc = sqlite3ExprIsInteger(p->pLeft, pValue);
      break;
    }
    case TK_UMINUS: {
      int v;
      if( sqlite3ExprIsInteger(p->pLeft, &v) ){
        assert( v!=(-2147483647-1) );
        *pValue = -v;
        rc = 1;
      }
      break;
    }
    default: break;
  }
  return rc;
}